

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::~RandomFloatingGenerator
          (RandomFloatingGenerator<long_double> *this)

{
  unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl> *in_RDI;
  
  Catch::Detail::unique_ptr<Catch::Generators::RandomFloatingGenerator<long_double>::PImpl>::
  ~unique_ptr(in_RDI);
  IGenerator<long_double>::~IGenerator((IGenerator<long_double> *)0x184616);
  return;
}

Assistant:

RandomFloatingGenerator<long double>::~RandomFloatingGenerator() =
            default;